

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O3

string * AddLineNumber(string *__return_storage_ptr__,string *s,uint64_t line,string *prefix)

{
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (line == 0xffffffffffffffff) {
    std::operator+(__return_storage_ptr__,prefix,s);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(line ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddLineNumber(const std::string& s,uint64_t line /*= LINE_NOT_SPECIFIED*/, const std::string& prefix = "")
{
    return line == STEP::SyntaxError::LINE_NOT_SPECIFIED ? prefix+s : static_cast<std::string>( (Formatter::format(),prefix,"(line ",line,") ",s) );
}